

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnvisci.cpp
# Opt level: O2

void UConverter_fromUnicode_ISCII_OFFSETS_LOGIC(UConverterFromUnicodeArgs *args,UErrorCode *err)

{
  char cVar1;
  UChar UVar2;
  short sVar3;
  ISCIILang IVar4;
  UChar *pUVar5;
  byte *pbVar6;
  void *pvVar7;
  UChar *pUVar8;
  UErrorCode UVar9;
  uint uVar10;
  UConverter *pUVar11;
  short sVar12;
  uint16_t uVar13;
  byte bVar15;
  int iVar14;
  int *piVar16;
  UChar *pUVar17;
  uint uVar18;
  UChar *pUVar19;
  byte bVar20;
  byte *pbVar21;
  int iVar22;
  byte *pbVar23;
  bool bVar24;
  uint local_4c;
  
  pUVar11 = args->converter;
  pUVar17 = args->source;
  pUVar5 = args->sourceLimit;
  pbVar23 = (byte *)args->target;
  pbVar6 = (byte *)args->targetLimit;
  if ((pUVar5 < pUVar17 || pbVar6 < pbVar23) || pUVar11 == (UConverter *)0x0) {
    *err = U_ILLEGAL_ARGUMENT_ERROR;
    return;
  }
  uVar18 = pUVar11->fromUChar32;
  if (uVar18 == 0) {
    pvVar7 = pUVar11->extraInfo;
    uVar10 = (uint)(*(ushort *)((long)pvVar7 + 6) >> 7);
    piVar16 = args->offsets;
LAB_0016ea42:
    pUVar19 = pUVar17;
    do {
      pUVar19 = pUVar19 + 1;
      if (pUVar5 <= pUVar17) goto LAB_0016efda;
      pUVar11 = args->converter;
      if (pUVar11->fromUnicodeStatus == 10) {
        IVar4 = lookupInitialData[uVar10 & 0xffff].isciiLang;
        pUVar11->fromUnicodeStatus = 0;
        bVar15 = (byte)IVar4;
        if (pbVar6 <= pbVar23) {
          cVar1 = pUVar11->charErrorBufferLength;
          pUVar11->charErrorBufferLength = cVar1 + '\x01';
          pUVar11->charErrorBuffer[cVar1] = 0xef;
          pUVar11 = args->converter;
          cVar1 = pUVar11->charErrorBufferLength;
          pUVar11->charErrorBufferLength = cVar1 + '\x01';
          pUVar11->charErrorBuffer[cVar1] = bVar15;
          *err = U_BUFFER_OVERFLOW_ERROR;
          goto LAB_0016efda;
        }
        pUVar8 = args->source;
        pbVar21 = pbVar23 + 1;
        *pbVar23 = 0xef;
        if (piVar16 == (int *)0x0) {
          if (pbVar6 <= pbVar21) goto LAB_0016efa0;
          *pbVar21 = bVar15;
          piVar16 = (int *)0x0;
        }
        else {
          iVar14 = (int)((ulong)((long)pUVar19 + (-2 - (long)pUVar8)) >> 1) + -1;
          *piVar16 = iVar14;
          if (pbVar6 <= pbVar21) {
LAB_0016efa0:
            pUVar11 = args->converter;
            cVar1 = pUVar11->charErrorBufferLength;
            pUVar11->charErrorBufferLength = cVar1 + '\x01';
            pUVar11->charErrorBuffer[cVar1] = bVar15;
            *err = U_BUFFER_OVERFLOW_ERROR;
            pbVar23 = pbVar21;
            goto LAB_0016efda;
          }
          *pbVar21 = bVar15;
          piVar16[1] = iVar14;
          piVar16 = piVar16 + 2;
        }
        pbVar23 = pbVar23 + 2;
        if (U_ZERO_ERROR < *err) goto LAB_0016efda;
      }
      UVar2 = *pUVar17;
      uVar18 = (uint)(ushort)UVar2;
      if (uVar18 < 0xa1) {
        pUVar11 = args->converter;
        pUVar11->fromUnicodeStatus = uVar18;
        if (pbVar23 < pbVar6) {
          pUVar8 = args->source;
          *pbVar23 = (byte)UVar2;
          if (piVar16 == (int *)0x0) {
            piVar16 = (int *)0x0;
          }
          else {
            *piVar16 = (int)((ulong)((long)pUVar19 - (long)pUVar8) >> 1) + -1;
            piVar16 = piVar16 + 1;
          }
          pbVar23 = pbVar23 + 1;
          if (*err < U_ILLEGAL_ARGUMENT_ERROR) goto LAB_0016eb2f;
        }
        else {
          cVar1 = pUVar11->charErrorBufferLength;
          pUVar11->charErrorBufferLength = cVar1 + '\x01';
          pUVar11->charErrorBuffer[cVar1] = (byte)UVar2;
          *err = U_BUFFER_OVERFLOW_ERROR;
        }
        pUVar17 = pUVar17 + 1;
        goto LAB_0016efda;
      }
      sVar3 = *(short *)((long)pvVar7 + 2);
      if (uVar18 != 0x200c) {
        if (uVar18 == 0x200d) {
          *(undefined2 *)((long)pvVar7 + 2) = 0;
          local_4c = (uint)(sVar3 != 0) * 0x10 + 0xd9;
          uVar18 = 0x200d;
          goto LAB_0016eca0;
        }
        local_4c = 0xffff;
        if ((ushort)(uVar18 - 0x900) < 0x480) {
          if ((ushort)(UVar2 + L'\xf69a') < 0xfffe) {
            uVar10 = (int)(uVar18 - 0x900) / 0x80;
            sVar12 = (short)(uVar10 << 7);
            if ((sVar12 == *(short *)((long)pvVar7 + 6)) && (*(char *)((long)pvVar7 + 0x18) == '\0')
               ) {
              bVar24 = true;
            }
            else {
              *(short *)((long)pvVar7 + 6) = sVar12;
              *(MaskEnum *)((long)pvVar7 + 0xc) = lookupInitialData[uVar10 & 0xffff].maskEnum;
              *(undefined1 *)((long)pvVar7 + 0x18) = 0;
              bVar24 = false;
            }
            if (sVar12 == 0x100) {
              if (uVar18 == 0xa70) {
                uVar18 = 0xa02;
              }
              else if (uVar18 == 0xa71) {
                *(undefined2 *)((long)pvVar7 + 2) = 0xa71;
                uVar18 = 0xa71;
              }
            }
            uVar18 = uVar18 - (uVar10 << 7 & 0xffff);
          }
          else {
            bVar24 = true;
          }
          uVar13 = fromUnicodeTable[uVar18 & 0xff];
          if ((*(uint *)((long)pvVar7 + 0xc) & (uint)""[uVar18 & 0xff]) == 0) {
            if (*(short *)((long)pvVar7 + 6) != 0x300) {
              uVar13 = 0xffff;
            }
            if (uVar18 != 0x931) {
              uVar13 = 0xffff;
            }
          }
          local_4c = (uint)uVar13;
          if (!bVar24) {
            bVar15 = (byte)lookupInitialData[uVar10 & 0xffff].isciiLang;
            if (pbVar6 <= pbVar23) {
              pUVar11 = args->converter;
              cVar1 = pUVar11->charErrorBufferLength;
              pUVar11->charErrorBufferLength = cVar1 + '\x01';
              pUVar11->charErrorBuffer[cVar1] = 0xef;
              pUVar11 = args->converter;
              cVar1 = pUVar11->charErrorBufferLength;
              pUVar11->charErrorBufferLength = cVar1 + '\x01';
              pUVar11->charErrorBuffer[cVar1] = bVar15;
              *err = U_BUFFER_OVERFLOW_ERROR;
              goto LAB_0016eca0;
            }
            pUVar8 = args->source;
            pbVar21 = pbVar23 + 1;
            *pbVar23 = 0xef;
            if (piVar16 == (int *)0x0) {
              if (pbVar6 <= pbVar21) {
                piVar16 = (int *)0x0;
                goto LAB_0016ef35;
              }
              *pbVar21 = bVar15;
              piVar16 = (int *)0x0;
            }
            else {
              iVar14 = (int)((ulong)((long)pUVar19 - (long)pUVar8) >> 1) + -1;
              *piVar16 = iVar14;
              if (pbVar6 <= pbVar21) {
                piVar16 = piVar16 + 1;
LAB_0016ef35:
                pUVar11 = args->converter;
                cVar1 = pUVar11->charErrorBufferLength;
                pUVar11->charErrorBufferLength = cVar1 + '\x01';
                pUVar11->charErrorBuffer[cVar1] = bVar15;
                *err = U_BUFFER_OVERFLOW_ERROR;
                pbVar23 = pbVar21;
                goto LAB_0016eca0;
              }
              *pbVar21 = bVar15;
              piVar16[1] = iVar14;
              piVar16 = piVar16 + 2;
            }
            pbVar23 = pbVar23 + 2;
            if (U_ZERO_ERROR < *err) goto LAB_0016eca0;
          }
          if ((uVar18 == 0x971) && (*(short *)((long)pvVar7 + 6) == 0x100)) goto LAB_0016eea9;
        }
        *(undefined2 *)((long)pvVar7 + 2) = 0;
        goto LAB_0016eca0;
      }
      if (sVar3 != 0) goto LAB_0016ec00;
LAB_0016eb2f:
      pUVar17 = pUVar17 + 1;
    } while( true );
  }
LAB_0016e9df:
  UVar9 = U_ZERO_ERROR;
  if (pUVar17 < pUVar5) {
    bVar24 = ((ushort)*pUVar17 & 0xfc00) == 0xdc00;
    UVar9 = !bVar24 + 10 + (uint)!bVar24;
    uVar10 = uVar18 * 0x400 + (uint)(ushort)*pUVar17 + 0xfca02400;
    if (!bVar24) {
      uVar10 = uVar18;
    }
    uVar18 = uVar10;
    pUVar17 = pUVar17 + bVar24;
  }
LAB_0016ea20:
  *err = UVar9;
  args->converter->fromUChar32 = uVar18;
LAB_0016efda:
  args->source = pUVar17;
  args->target = (char *)pbVar23;
  return;
LAB_0016ec00:
  *(undefined2 *)((long)pvVar7 + 2) = 0;
  uVar18 = 0x200c;
  local_4c = 0xe8;
LAB_0016eca0:
  bVar20 = (byte)local_4c;
  bVar15 = (byte)(local_4c >> 8);
  if ((((*(short *)((long)pvVar7 + 6) == 0x100) && (sVar3 == 0xa71)) &&
      (0xffffffaf < uVar18 - 0x950)) && ((""[uVar18 - 0x900] & 1) != 0)) {
    *(undefined2 *)((long)pvVar7 + 2) = 0;
    bVar15 = bVar15 | 0xe8;
    if (pbVar6 <= pbVar23) {
      pUVar11 = args->converter;
      if ((local_4c << 0x10 & 0xff0000) != 0) {
        cVar1 = pUVar11->charErrorBufferLength;
        pUVar11->charErrorBufferLength = cVar1 + '\x01';
        pUVar11->charErrorBuffer[cVar1] = bVar20;
        pUVar11 = args->converter;
      }
      cVar1 = pUVar11->charErrorBufferLength;
      pUVar11->charErrorBufferLength = cVar1 + '\x01';
      pUVar11->charErrorBuffer[cVar1] = bVar15;
      pUVar11 = args->converter;
LAB_0016f0ad:
      pUVar17 = pUVar17 + 1;
      cVar1 = pUVar11->charErrorBufferLength;
      pUVar11->charErrorBufferLength = cVar1 + '\x01';
      pUVar11->charErrorBuffer[cVar1] = bVar20;
      *err = U_BUFFER_OVERFLOW_ERROR;
      goto LAB_0016efda;
    }
    iVar14 = (int)((ulong)((long)pUVar19 - (long)args->source) >> 1);
    iVar22 = iVar14 + -1;
    if (0xffff < (local_4c << 0x10 | local_4c)) {
      *pbVar23 = bVar20;
      pbVar23 = pbVar23 + 1;
      if (piVar16 == (int *)0x0) {
        piVar16 = (int *)0x0;
      }
      else {
        iVar22 = iVar14 + -2;
        *piVar16 = iVar22;
        piVar16 = piVar16 + 1;
      }
    }
    if (pbVar6 <= pbVar23) {
      pUVar11 = args->converter;
      cVar1 = pUVar11->charErrorBufferLength;
      pUVar11->charErrorBufferLength = cVar1 + '\x01';
      pUVar11->charErrorBuffer[cVar1] = bVar15;
      pUVar11 = args->converter;
      cVar1 = pUVar11->charErrorBufferLength;
      pUVar11->charErrorBufferLength = cVar1 + '\x01';
      pUVar11->charErrorBuffer[cVar1] = bVar20;
      *err = U_BUFFER_OVERFLOW_ERROR;
LAB_0016f104:
      pUVar17 = pUVar17 + 1;
      goto LAB_0016efda;
    }
    pbVar21 = pbVar23 + 1;
    *pbVar23 = bVar15;
    if (piVar16 == (int *)0x0) {
      if (pbVar6 <= pbVar21) goto LAB_0016f01c;
      *pbVar21 = bVar20;
      piVar16 = (int *)0x0;
    }
    else {
      *piVar16 = iVar22;
      if (pbVar6 <= pbVar21) goto LAB_0016f01c;
      *pbVar21 = bVar20;
      piVar16[1] = iVar22;
      piVar16 = piVar16 + 2;
    }
    pbVar23 = pbVar23 + 2;
  }
  else {
    if (local_4c == 0xe8) {
      *(undefined2 *)((long)pvVar7 + 2) = 0xe8;
    }
    else if (local_4c == 0xffff) {
      pUVar17 = pUVar17 + 1;
      if ((uVar18 & 0xfffff800) == 0xd800) {
        if ((uVar18 >> 10 & 1) == 0) goto LAB_0016e9df;
        UVar9 = U_ILLEGAL_CHAR_FOUND;
      }
      else {
        UVar9 = U_INVALID_CHAR_FOUND;
      }
      goto LAB_0016ea20;
    }
    if (pbVar6 <= pbVar23) {
      pUVar11 = args->converter;
      if ((local_4c & 0xff00) != 0) {
        cVar1 = pUVar11->charErrorBufferLength;
        pUVar11->charErrorBufferLength = cVar1 + '\x01';
        pUVar11->charErrorBuffer[cVar1] = bVar15;
        pUVar11 = args->converter;
      }
      goto LAB_0016f0ad;
    }
    iVar14 = (int)((ulong)((long)pUVar19 - (long)args->source) >> 1) + -1;
    if (local_4c < 0x100) {
      *pbVar23 = bVar20;
      pbVar23 = pbVar23 + 1;
      if (piVar16 != (int *)0x0) {
        *piVar16 = iVar14;
        piVar16 = piVar16 + 1;
        goto LAB_0016ee9d;
      }
    }
    else {
      pbVar21 = pbVar23 + 1;
      *pbVar23 = bVar15;
      if (piVar16 != (int *)0x0) {
        *piVar16 = iVar14;
        if (pbVar21 < pbVar6) {
          pbVar23[1] = bVar20;
          pbVar23 = pbVar23 + 2;
          piVar16[1] = iVar14;
          piVar16 = piVar16 + 2;
          goto LAB_0016ee9d;
        }
LAB_0016f01c:
        pUVar11 = args->converter;
        cVar1 = pUVar11->charErrorBufferLength;
        pUVar11->charErrorBufferLength = cVar1 + '\x01';
        pUVar11->charErrorBuffer[cVar1] = bVar20;
        *err = U_BUFFER_OVERFLOW_ERROR;
        pUVar17 = pUVar17 + 1;
        pbVar23 = pbVar21;
        goto LAB_0016efda;
      }
      if (pbVar6 <= pbVar21) goto LAB_0016f01c;
      pbVar23[1] = bVar20;
      pbVar23 = pbVar23 + 2;
    }
    piVar16 = (int *)0x0;
  }
LAB_0016ee9d:
  if (U_ZERO_ERROR < *err) goto LAB_0016f104;
LAB_0016eea9:
  pUVar17 = pUVar17 + 1;
  goto LAB_0016ea42;
}

Assistant:

static void U_CALLCONV
UConverter_fromUnicode_ISCII_OFFSETS_LOGIC(
        UConverterFromUnicodeArgs * args, UErrorCode * err) {
    const UChar *source = args->source;
    const UChar *sourceLimit = args->sourceLimit;
    unsigned char *target = (unsigned char *) args->target;
    unsigned char *targetLimit = (unsigned char *) args->targetLimit;
    int32_t* offsets = args->offsets;
    uint32_t targetByteUnit = 0x0000;
    UChar32 sourceChar = 0x0000;
    UChar32 tempContextFromUnicode = 0x0000;    /* For special handling of the Gurmukhi script. */
    UConverterDataISCII *converterData;
    uint16_t newDelta=0;
    uint16_t range = 0;
    UBool deltaChanged = FALSE;

    if ((args->converter == NULL) || (args->targetLimit < args->target) || (args->sourceLimit < args->source)) {
        *err = U_ILLEGAL_ARGUMENT_ERROR;
        return;
    }
    /* initialize data */
    converterData=(UConverterDataISCII*)args->converter->extraInfo;
    newDelta=converterData->currentDeltaFromUnicode;
    range = (uint16_t)(newDelta/DELTA);

    if ((sourceChar = args->converter->fromUChar32)!=0) {
        goto getTrail;
    }

    /*writing the char to the output stream */
    while (source < sourceLimit) {
        /* Write the language code following LF only if LF is not the last character. */
        if (args->converter->fromUnicodeStatus == LF) {
            targetByteUnit = ATR<<8;
            targetByteUnit += (uint8_t) lookupInitialData[range].isciiLang;
            args->converter->fromUnicodeStatus = 0x0000;
            /* now append ATR and language code */
            WRITE_TO_TARGET_FROM_U(args,offsets,source,target,targetLimit,targetByteUnit,err);
            if (U_FAILURE(*err)) {
                break;
            }
        }
        
        sourceChar = *source++;
        tempContextFromUnicode = converterData->contextCharFromUnicode;
        
        targetByteUnit = missingCharMarker;
        
        /*check if input is in ASCII and C0 control codes range*/
        if (sourceChar <= ASCII_END) {
            args->converter->fromUnicodeStatus = sourceChar;
            WRITE_TO_TARGET_FROM_U(args,offsets,source,target,targetLimit,sourceChar,err);
            if (U_FAILURE(*err)) {
                break;
            }
            continue;
        }
        switch (sourceChar) {
        case ZWNJ:
            /* contextChar has HALANT */
            if (converterData->contextCharFromUnicode) {
                converterData->contextCharFromUnicode = 0x00;
                targetByteUnit = ISCII_HALANT;
            } else {
                /* consume ZWNJ and continue */
                converterData->contextCharFromUnicode = 0x00;
                continue;
            }
            break;
        case ZWJ:
            /* contextChar has HALANT */
            if (converterData->contextCharFromUnicode) {
                targetByteUnit = ISCII_NUKTA;
            } else {
                targetByteUnit =ISCII_INV;
            }
            converterData->contextCharFromUnicode = 0x00;
            break;
        default:
            /* is the sourceChar in the INDIC_RANGE? */
            if ((uint16_t)(INDIC_BLOCK_END-sourceChar) <= INDIC_RANGE) {
                /* Danda and Double Danda are valid in Northern scripts.. since Unicode
                 * does not include these codepoints in all Northern scrips we need to
                 * filter them out
                 */
                if (sourceChar!= DANDA && sourceChar != DOUBLE_DANDA) {
                    /* find out to which block the souceChar belongs*/
                    range =(uint16_t)((sourceChar-INDIC_BLOCK_BEGIN)/DELTA);
                    newDelta =(uint16_t)(range*DELTA);

                    /* Now are we in the same block as the previous? */
                    if (newDelta!= converterData->currentDeltaFromUnicode || converterData->isFirstBuffer) {
                        converterData->currentDeltaFromUnicode = newDelta;
                        converterData->currentMaskFromUnicode = lookupInitialData[range].maskEnum;
                        deltaChanged =TRUE;
                        converterData->isFirstBuffer=FALSE;
                    }
                    
                    if (converterData->currentDeltaFromUnicode == PNJ_DELTA) { 
                        if (sourceChar == PNJ_TIPPI) {
                            /* Make sure Tippi is converterd to Bindi. */
                            sourceChar = PNJ_BINDI;
                        } else if (sourceChar == PNJ_ADHAK) {
                            /* This is for consonant cluster handling. */
                            converterData->contextCharFromUnicode = PNJ_ADHAK;
                        }
                        
                    }
                    /* Normalize all Indic codepoints to Devanagari and map them to ISCII */
                    /* now subtract the new delta from sourceChar*/
                    sourceChar -= converterData->currentDeltaFromUnicode;
                }

                /* get the target byte unit */
                targetByteUnit=fromUnicodeTable[(uint8_t)sourceChar];

                /* is the code point valid in current script? */
                if ((validityTable[(uint8_t)sourceChar] & converterData->currentMaskFromUnicode)==0) {
                    /* Vocallic RR is assigned in ISCII Telugu and Unicode */
                    if (converterData->currentDeltaFromUnicode!=(TELUGU_DELTA) || sourceChar!=VOCALLIC_RR) {
                        targetByteUnit=missingCharMarker;
                    }
                }

                if (deltaChanged) {
                    /* we are in a script block which is different than
                     * previous sourceChar's script block write ATR and language codes
                     */
                    uint32_t temp=0;
                    temp =(uint16_t)(ATR<<8);
                    temp += (uint16_t)((uint8_t) lookupInitialData[range].isciiLang);
                    /* reset */
                    deltaChanged=FALSE;
                    /* now append ATR and language code */
                    WRITE_TO_TARGET_FROM_U(args,offsets,source,target,targetLimit,temp,err);
                    if (U_FAILURE(*err)) {
                        break;
                    }
                }
                
                if (converterData->currentDeltaFromUnicode == PNJ_DELTA && (sourceChar + PNJ_DELTA) == PNJ_ADHAK) {
                    continue;
                }
            }
            /* reset context char */
            converterData->contextCharFromUnicode = 0x00;
            break;
        }
        if (converterData->currentDeltaFromUnicode == PNJ_DELTA && tempContextFromUnicode == PNJ_ADHAK && isPNJConsonant((sourceChar + PNJ_DELTA))) {
            /* If the previous codepoint is Adhak and the current codepoint is a consonant, the targetByteUnit should be C + Halant + C. */
            /* reset context char */
            converterData->contextCharFromUnicode = 0x0000;
            targetByteUnit = targetByteUnit << 16 | ISCII_HALANT << 8 | targetByteUnit;
            /* write targetByteUnit to target */
            WRITE_TO_TARGET_FROM_U(args, offsets, source, target, targetLimit, targetByteUnit,err);
            if (U_FAILURE(*err)) {
                break;
            }
        } else if (targetByteUnit != missingCharMarker) {
            if (targetByteUnit==ISCII_HALANT) {
                converterData->contextCharFromUnicode = (UChar)targetByteUnit;
            }
            /* write targetByteUnit to target*/
            WRITE_TO_TARGET_FROM_U(args,offsets,source,target,targetLimit,targetByteUnit,err);
            if (U_FAILURE(*err)) {
                break;
            }
        } else {
            /* oops.. the code point is unassigned */
            /*check if the char is a First surrogate*/
            if (U16_IS_SURROGATE(sourceChar)) {
                if (U16_IS_SURROGATE_LEAD(sourceChar)) {
getTrail:
                    /*look ahead to find the trail surrogate*/
                    if (source < sourceLimit) {
                        /* test the following code unit */
                        UChar trail= (*source);
                        if (U16_IS_TRAIL(trail)) {
                            source++;
                            sourceChar=U16_GET_SUPPLEMENTARY(sourceChar, trail);
                            *err =U_INVALID_CHAR_FOUND;
                            /* convert this surrogate code point */
                            /* exit this condition tree */
                        } else {
                            /* this is an unmatched lead code unit (1st surrogate) */
                            /* callback(illegal) */
                            *err=U_ILLEGAL_CHAR_FOUND;
                        }
                    } else {
                        /* no more input */
                        *err = U_ZERO_ERROR;
                    }
                } else {
                    /* this is an unmatched trail code unit (2nd surrogate) */
                    /* callback(illegal) */
                    *err=U_ILLEGAL_CHAR_FOUND;
                }
            } else {
                /* callback(unassigned) for a BMP code point */
                *err = U_INVALID_CHAR_FOUND;
            }

            args->converter->fromUChar32=sourceChar;
            break;
        }
    }/* end while(mySourceIndex<mySourceLength) */

    /*save the state and return */
    args->source = source;
    args->target = (char*)target;
}